

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::EventContext::EventContext
          (EventContext *this,TracePacketHandle *trace_packet,
          TrackEventIncrementalState *incremental_state,TrackEventTlsState *tls_state)

{
  TrackEvent *pTVar1;
  
  (this->trace_packet_).super_MessageHandleBase.message_ =
       (trace_packet->super_MessageHandleBase).message_;
  (trace_packet->super_MessageHandleBase).message_ = (Message *)0x0;
  pTVar1 = protos::pbzero::TracePacket::set_track_event<perfetto::protos::pbzero::TrackEvent>
                     ((TracePacket *)(this->trace_packet_).super_MessageHandleBase.message_);
  this->event_ = pTVar1;
  this->incremental_state_ = incremental_state;
  this->tls_state_ = tls_state;
  return;
}

Assistant:

EventContext::EventContext(
    EventContext::TracePacketHandle trace_packet,
    internal::TrackEventIncrementalState* incremental_state,
    const internal::TrackEventTlsState* tls_state)
    : trace_packet_(std::move(trace_packet)),
      event_(trace_packet_->set_track_event()),
      incremental_state_(incremental_state),
      tls_state_(tls_state) {}